

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O0

void test_list_insert(void)

{
  int iVar1;
  LIST_NODE *pLVar2;
  DATA *pDVar3;
  LIST_NODE *pLVar4;
  int n;
  DATA xxx;
  DATA *data;
  LIST_NODE *node;
  LIST list;
  LIST_NODE *in_stack_ffffffffffffff88;
  LIST *in_stack_ffffffffffffff90;
  int local_3c;
  LIST_NODE LStack_30;
  LIST_NODE **local_20;
  LIST_NODE *local_18;
  LIST local_10;
  
  list_init(&local_10);
  alloc_data((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  list_append(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  alloc_data((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  list_prepend(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pLVar2 = list_head(&local_10);
  pDVar3 = alloc_data((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  list_insert_after(&local_10,pLVar2,&pDVar3->list_node);
  pLVar2 = list_head(&local_10);
  pDVar3 = alloc_data((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  list_insert_before(&local_10,pLVar2,&pDVar3->list_node);
  pLVar2 = list_tail(&local_10);
  pDVar3 = alloc_data((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  list_insert_before(&local_10,pLVar2,&pDVar3->list_node);
  pLVar2 = list_tail(&local_10);
  pDVar3 = alloc_data((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  list_insert_after(&local_10,pLVar2,&pDVar3->list_node);
  list_append(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  list_remove(&local_10,&LStack_30);
  list_prepend(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  list_remove(&local_10,&LStack_30);
  pLVar2 = list_head(&local_10);
  list_insert_after(&local_10,pLVar2,&LStack_30);
  list_remove(&local_10,&LStack_30);
  local_18 = list_head(&local_10);
  local_3c = 1;
  while( true ) {
    pLVar2 = local_18;
    pLVar4 = list_end(&local_10);
    if (pLVar2 == pLVar4) break;
    local_20 = &local_18[-1].n;
    acutest_check_((int)(ulong)(*(int *)local_20 == local_3c),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x83,"%s","data->value == n");
    local_18 = list_next(local_18);
    local_3c = local_3c + 1;
  }
  local_18 = list_tail(&local_10);
  local_3c = 6;
  while( true ) {
    pLVar2 = local_18;
    pLVar4 = list_end(&local_10);
    if (pLVar2 == pLVar4) break;
    local_20 = &local_18[-1].n;
    acutest_check_((int)(ulong)(*(int *)local_20 == local_3c),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x89,"%s","data->value == n");
    local_18 = list_prev(local_18);
    local_3c = local_3c + -1;
  }
  local_3c = 0;
  while( true ) {
    iVar1 = list_is_empty(&local_10);
    if (iVar1 != 0) break;
    local_18 = list_head(&local_10);
    list_remove(&local_10,local_18);
    free(&local_18[-1].n);
    local_3c = local_3c + 1;
  }
  acutest_check_((int)(ulong)(local_3c == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x94,"%s","n == 6");
  return;
}

Assistant:

static void
test_list_insert(void)
{
    LIST list;
    LIST_NODE* node;
    DATA* data;
    DATA xxx;
    int n;

    /* Create simple list. */
    list_init(&list);
    list_append(&list, &alloc_data(5)->list_node);                              /* 5 */
    list_prepend(&list, &alloc_data(2)->list_node);                             /* 2 -> 5 */
    list_insert_after(&list, list_head(&list), &alloc_data(3)->list_node);      /* 1 -> 2 -> 3 */
    list_insert_before(&list, list_head(&list), &alloc_data(1)->list_node);     /* 1 -> 2 -> 3 -> 5 */
    list_insert_before(&list, list_tail(&list), &alloc_data(4)->list_node);     /* 1 -> 2 -> 3 -> 4 -> 5 */
    list_insert_after(&list, list_tail(&list), &alloc_data(6)->list_node);      /* 1 -> 2 -> 3 -> 4 -> 5 -> 6 */

    /* Verify that removals do not break integrity. */
    xxx.value = 666;
    list_append(&list, &xxx.list_node);
    list_remove(&list, &xxx.list_node);
    list_prepend(&list, &xxx.list_node);
    list_remove(&list, &xxx.list_node);
    list_insert_after(&list, list_head(&list), &xxx.list_node);
    list_remove(&list, &xxx.list_node);

    /* Iterate forward. */
    for(node = list_head(&list), n = 1; node != list_end(&list); node = list_next(node), n++) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Iterate backward. */
    for(node = list_tail(&list), n = 6; node != list_end(&list); node = list_prev(node), n--) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!list_is_empty(&list)) {
        node = list_head(&list);
        list_remove(&list, node);
        free(LIST_DATA(node, DATA, list_node));
        n++;
    }
    TEST_CHECK(n == 6);
}